

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>
::UntypedPerformAction
          (FunctionMockerBase<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<TestFunction> *pAVar1;
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *in_RDX;
  ArgumentTuple *args;
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> action;
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> local_28;
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *local_18;
  
  local_18 = in_RDX;
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>::Action
            (&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<TestFunction>::
           PerformAction<TestFunction(fmt::BasicStringRef<char>,int,mp::func::Type)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)>::~Action
            ((Action<TestFunction_(fmt::BasicStringRef<char>,_int,_mp::func::Type)> *)0x28fb11);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }